

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

string * cmake::FindCacheFile(string *__return_storage_ptr__,string *binaryDir)

{
  bool bVar1;
  ulong uVar2;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  undefined1 local_90 [8];
  string cachePathFound;
  string cmakeFiles;
  string cacheFile;
  string *binaryDir_local;
  string *cachePath;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)binaryDir);
  cmsys::SystemTools::ConvertToUnixSlashes(__return_storage_ptr__);
  std::__cxx11::string::string
            ((string *)(cmakeFiles.field_2._M_local_buf + 8),(string *)__return_storage_ptr__);
  std::__cxx11::string::operator+=
            ((string *)(cmakeFiles.field_2._M_local_buf + 8),"/CMakeCache.txt");
  bVar1 = cmsys::SystemTools::FileExists((string *)((long)&cmakeFiles.field_2 + 8));
  if (!bVar1) {
    std::__cxx11::string::string
              ((string *)(cachePathFound.field_2._M_local_buf + 8),(string *)__return_storage_ptr__)
    ;
    std::__cxx11::string::operator+=
              ((string *)(cachePathFound.field_2._M_local_buf + 8),"/CMakeFiles");
    bVar1 = cmsys::SystemTools::FileExists((string *)((long)&cachePathFound.field_2 + 8));
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"CMakeCache.txt",&local_b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"/",&local_d9);
      cmSystemTools::FileExistsInParentDirectories
                ((string *)local_90,&local_b0,__return_storage_ptr__,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator(&local_d9);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator(&local_b1);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        cmsys::SystemTools::GetFilenamePath(&local_100,(string *)local_90);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_100);
        std::__cxx11::string::~string((string *)&local_100);
      }
      std::__cxx11::string::~string((string *)local_90);
    }
    std::__cxx11::string::~string((string *)(cachePathFound.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::~string((string *)(cmakeFiles.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string cmake::FindCacheFile(const std::string& binaryDir)
{
  std::string cachePath = binaryDir;
  cmSystemTools::ConvertToUnixSlashes(cachePath);
  std::string cacheFile = cachePath;
  cacheFile += "/CMakeCache.txt";
  if (!cmSystemTools::FileExists(cacheFile)) {
    // search in parent directories for cache
    std::string cmakeFiles = cachePath;
    cmakeFiles += "/CMakeFiles";
    if (cmSystemTools::FileExists(cmakeFiles)) {
      std::string cachePathFound =
        cmSystemTools::FileExistsInParentDirectories("CMakeCache.txt",
                                                     cachePath, "/");
      if (!cachePathFound.empty()) {
        cachePath = cmSystemTools::GetFilenamePath(cachePathFound);
      }
    }
  }
  return cachePath;
}